

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demux.c
# Opt level: O0

ParseStatus ParseSingleImage(WebPDemuxer *dmux)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  Frame *frame_00;
  WebPDemuxer *in_RDI;
  int has_alpha;
  int image_added;
  ParseStatus status;
  Frame *frame;
  MemBuffer_conflict *mem;
  size_t min_size;
  Frame *in_stack_00000048;
  MemBuffer_conflict *in_stack_00000050;
  uint32_t in_stack_0000005c;
  int in_stack_00000060;
  int iVar4;
  undefined4 in_stack_ffffffffffffffd4;
  uint64_t in_stack_ffffffffffffffd8;
  ParseStatus local_4;
  
  iVar4 = 0;
  if (in_RDI->frames == (Frame *)0x0) {
    iVar2 = SizeIsInvalid(&in_RDI->mem,8);
    if (iVar2 == 0) {
      sVar3 = MemDataSize(&in_RDI->mem);
      if (sVar3 < 8) {
        local_4 = PARSE_NEED_MORE_DATA;
      }
      else {
        frame_00 = (Frame *)WebPSafeCalloc(in_stack_ffffffffffffffd8,
                                           CONCAT44(in_stack_ffffffffffffffd4,iVar4));
        if (frame_00 == (Frame *)0x0) {
          local_4 = PARSE_ERROR;
        }
        else {
          local_4 = StoreFrame(in_stack_00000060,in_stack_0000005c,in_stack_00000050,
                               in_stack_00000048);
          if (local_4 != PARSE_ERROR) {
            if (((in_RDI->feature_flags & 0x10) == 0) && (frame_00->img_components[1].size != 0)) {
              frame_00->img_components[1].offset = 0;
              frame_00->img_components[1].size = 0;
              frame_00->has_alpha = 0;
            }
            if (((in_RDI->is_ext_format == 0) && (0 < frame_00->width)) && (0 < frame_00->height)) {
              in_RDI->state = WEBP_DEMUX_PARSED_HEADER;
              in_RDI->canvas_width = frame_00->width;
              in_RDI->canvas_height = frame_00->height;
              uVar1 = 0;
              if (frame_00->has_alpha != 0) {
                uVar1 = 0x10;
              }
              in_RDI->feature_flags = uVar1 | in_RDI->feature_flags;
            }
            iVar2 = AddFrame(in_RDI,frame_00);
            if (iVar2 == 0) {
              local_4 = PARSE_ERROR;
            }
            else {
              iVar4 = 1;
              in_RDI->num_frames = 1;
            }
          }
          if (iVar4 == 0) {
            WebPSafeFree((void *)0x1a8e42);
          }
        }
      }
    }
    else {
      local_4 = PARSE_ERROR;
    }
  }
  else {
    local_4 = PARSE_ERROR;
  }
  return local_4;
}

Assistant:

static ParseStatus ParseSingleImage(WebPDemuxer* const dmux) {
  const size_t min_size = CHUNK_HEADER_SIZE;
  MemBuffer* const mem = &dmux->mem;
  Frame* frame;
  ParseStatus status;
  int image_added = 0;

  if (dmux->frames != NULL) return PARSE_ERROR;
  if (SizeIsInvalid(mem, min_size)) return PARSE_ERROR;
  if (MemDataSize(mem) < min_size) return PARSE_NEED_MORE_DATA;

  frame = (Frame*)WebPSafeCalloc(1ULL, sizeof(*frame));
  if (frame == NULL) return PARSE_ERROR;

  // For the single image case we allow parsing of a partial frame, so no
  // minimum size is imposed here.
  status = StoreFrame(1, 0, &dmux->mem, frame);
  if (status != PARSE_ERROR) {
    const int has_alpha = !!(dmux->feature_flags & ALPHA_FLAG);
    // Clear any alpha when the alpha flag is missing.
    if (!has_alpha && frame->img_components[1].size > 0) {
      frame->img_components[1].offset = 0;
      frame->img_components[1].size = 0;
      frame->has_alpha = 0;
    }

    // Use the frame width/height as the canvas values for non-vp8x files.
    // Also, set ALPHA_FLAG if this is a lossless image with alpha.
    if (!dmux->is_ext_format && frame->width > 0 && frame->height > 0) {
      dmux->state = WEBP_DEMUX_PARSED_HEADER;
      dmux->canvas_width = frame->width;
      dmux->canvas_height = frame->height;
      dmux->feature_flags |= frame->has_alpha ? ALPHA_FLAG : 0;
    }
    if (!AddFrame(dmux, frame)) {
      status = PARSE_ERROR;  // last frame was left incomplete
    } else {
      image_added = 1;
      dmux->num_frames = 1;
    }
  }

  if (!image_added) WebPSafeFree(frame);
  return status;
}